

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct32_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  uint uVar9;
  int iVar10;
  int32_t *piVar11;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  uint in_R9D;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m256i offset;
  int log_range_out;
  __m256i x;
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rounding;
  __m256i cospi32;
  int32_t *cospi;
  char local_558;
  char local_54c;
  undefined1 local_500 [32];
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  byte local_420;
  char local_414;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  piVar11 = cospi_arr(in_EDX);
  uVar9 = piVar11[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar1 = vpinsrd_avx(auVar1,uVar9,2);
  auVar1 = vpinsrd_avx(auVar1,uVar9,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar2 = vpinsrd_avx(auVar2,uVar9,2);
  auVar2 = vpinsrd_avx(auVar2,uVar9,3);
  uStack_1f0 = auVar2._0_8_;
  uStack_1e8 = auVar2._8_8_;
  local_414 = (char)in_EDX;
  uVar9 = 1 << (local_414 - 1U & 0x1f);
  auVar2 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar2 = vpinsrd_avx(auVar2,uVar9,2);
  auVar2 = vpinsrd_avx(auVar2,uVar9,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar3 = vpinsrd_avx(auVar3,uVar9,2);
  auVar3 = vpinsrd_avx(auVar3,uVar9,3);
  auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
  uStack_1b0 = auVar13._0_8_;
  uStack_1a8 = auVar13._8_8_;
  iVar10 = 8;
  if (in_ECX != 0) {
    iVar10 = 6;
  }
  if (in_R8D + iVar10 < 0x10) {
    local_54c = '\x10';
  }
  else {
    local_54c = '\b';
    if (in_ECX != 0) {
      local_54c = '\x06';
    }
    local_54c = (char)in_R8D + local_54c;
  }
  uVar9 = -(1 << (local_54c - 1U & 0x1f));
  auVar13 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar13 = vpinsrd_avx(auVar13,uVar9,2);
  auVar13 = vpinsrd_avx(auVar13,uVar9,3);
  auVar12 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar12 = vpinsrd_avx(auVar12,uVar9,2);
  auVar12 = vpinsrd_avx(auVar12,uVar9,3);
  local_180 = auVar13._0_8_;
  uStack_178 = auVar13._8_8_;
  uStack_170 = auVar12._0_8_;
  uStack_168 = auVar12._8_8_;
  local_4c0 = local_180;
  uStack_4b8 = uStack_178;
  uStack_4b0 = uStack_170;
  uStack_4a8 = uStack_168;
  uVar9 = (1 << (local_54c - 1U & 0x1f)) - 1;
  auVar13 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar13 = vpinsrd_avx(auVar13,uVar9,2);
  auVar13 = vpinsrd_avx(auVar13,uVar9,3);
  auVar12 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
  auVar12 = vpinsrd_avx(auVar12,uVar9,2);
  auVar12 = vpinsrd_avx(auVar12,uVar9,3);
  auVar12 = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar12;
  auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
  auVar4._16_8_ = uStack_1f0;
  auVar4._0_16_ = auVar1;
  auVar4._24_8_ = uStack_1e8;
  auVar4 = vpmulld_avx2(*in_RDI,auVar4);
  auVar6._16_8_ = uStack_1b0;
  auVar6._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
  auVar6._24_8_ = uStack_1a8;
  auVar4 = vpaddd_avx2(auVar4,auVar6);
  local_500 = vpsrad_avx2(auVar4,ZEXT416(in_EDX));
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_558 = '\x10';
    }
    else {
      local_558 = (char)in_R8D + '\x06';
    }
    local_420 = (byte)in_R9D;
    uVar9 = (1 << (local_420 & 0x1f)) >> 1;
    auVar1 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
    auVar1 = vpinsrd_avx(auVar1,uVar9,2);
    auVar1 = vpinsrd_avx(auVar1,uVar9,3);
    auVar2 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
    auVar2 = vpinsrd_avx(auVar2,uVar9,2);
    auVar2 = vpinsrd_avx(auVar2,uVar9,3);
    uStack_f0 = auVar2._0_8_;
    uStack_e8 = auVar2._8_8_;
    uVar9 = -(1 << (local_558 - 1U & 0x1f));
    auVar2 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
    auVar2 = vpinsrd_avx(auVar2,uVar9,2);
    auVar2 = vpinsrd_avx(auVar2,uVar9,3);
    auVar3 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
    auVar3 = vpinsrd_avx(auVar3,uVar9,2);
    auVar3 = vpinsrd_avx(auVar3,uVar9,3);
    local_c0 = auVar2._0_8_;
    uStack_b8 = auVar2._8_8_;
    uStack_b0 = auVar3._0_8_;
    uStack_a8 = auVar3._8_8_;
    local_4c0 = local_c0;
    uStack_4b8 = uStack_b8;
    uStack_4b0 = uStack_b0;
    uStack_4a8 = uStack_a8;
    uVar9 = (1 << (local_558 - 1U & 0x1f)) - 1;
    auVar2 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
    auVar2 = vpinsrd_avx(auVar2,uVar9,2);
    auVar12 = vpinsrd_avx(auVar2,uVar9,3);
    auVar2 = vpinsrd_avx(ZEXT416(uVar9),uVar9,1);
    auVar2 = vpinsrd_avx(auVar2,uVar9,2);
    auVar13 = vpinsrd_avx(auVar2,uVar9,3);
    auVar5._16_8_ = uStack_f0;
    auVar5._0_16_ = auVar1;
    auVar5._24_8_ = uStack_e8;
    auVar4 = vpaddd_avx2(auVar5,local_500);
    local_500 = vpsrad_avx2(auVar4,ZEXT416(in_R9D));
  }
  uStack_4c8 = auVar13._8_8_;
  uStack_4d0 = auVar13._0_8_;
  auVar7._8_8_ = uStack_4b8;
  auVar7._0_8_ = local_4c0;
  auVar7._16_8_ = uStack_4b0;
  auVar7._24_8_ = uStack_4a8;
  auVar4 = vpmaxsd_avx2(local_500,auVar7);
  auVar8._16_8_ = uStack_4d0;
  auVar8._0_16_ = auVar12;
  auVar8._24_8_ = uStack_4c8;
  auVar4 = vpminsd_avx2(auVar4,auVar8);
  local_500._0_8_ = auVar4._0_8_;
  local_500._8_8_ = auVar4._8_8_;
  local_500._16_8_ = auVar4._16_8_;
  local_500._24_8_ = auVar4._24_8_;
  *in_RSI = local_500._0_8_;
  in_RSI[1] = local_500._8_8_;
  in_RSI[2] = local_500._16_8_;
  in_RSI[3] = local_500._24_8_;
  in_RSI[4] = local_500._0_8_;
  in_RSI[5] = local_500._8_8_;
  in_RSI[6] = local_500._16_8_;
  in_RSI[7] = local_500._24_8_;
  in_RSI[8] = local_500._0_8_;
  in_RSI[9] = local_500._8_8_;
  in_RSI[10] = local_500._16_8_;
  in_RSI[0xb] = local_500._24_8_;
  in_RSI[0xc] = local_500._0_8_;
  in_RSI[0xd] = local_500._8_8_;
  in_RSI[0xe] = local_500._16_8_;
  in_RSI[0xf] = local_500._24_8_;
  in_RSI[0x10] = local_500._0_8_;
  in_RSI[0x11] = local_500._8_8_;
  in_RSI[0x12] = local_500._16_8_;
  in_RSI[0x13] = local_500._24_8_;
  in_RSI[0x14] = local_500._0_8_;
  in_RSI[0x15] = local_500._8_8_;
  in_RSI[0x16] = local_500._16_8_;
  in_RSI[0x17] = local_500._24_8_;
  in_RSI[0x18] = local_500._0_8_;
  in_RSI[0x19] = local_500._8_8_;
  in_RSI[0x1a] = local_500._16_8_;
  in_RSI[0x1b] = local_500._24_8_;
  in_RSI[0x1c] = local_500._0_8_;
  in_RSI[0x1d] = local_500._8_8_;
  in_RSI[0x1e] = local_500._16_8_;
  in_RSI[0x1f] = local_500._24_8_;
  in_RSI[0x20] = local_500._0_8_;
  in_RSI[0x21] = local_500._8_8_;
  in_RSI[0x22] = local_500._16_8_;
  in_RSI[0x23] = local_500._24_8_;
  in_RSI[0x24] = local_500._0_8_;
  in_RSI[0x25] = local_500._8_8_;
  in_RSI[0x26] = local_500._16_8_;
  in_RSI[0x27] = local_500._24_8_;
  in_RSI[0x28] = local_500._0_8_;
  in_RSI[0x29] = local_500._8_8_;
  in_RSI[0x2a] = local_500._16_8_;
  in_RSI[0x2b] = local_500._24_8_;
  in_RSI[0x2c] = local_500._0_8_;
  in_RSI[0x2d] = local_500._8_8_;
  in_RSI[0x2e] = local_500._16_8_;
  in_RSI[0x2f] = local_500._24_8_;
  in_RSI[0x30] = local_500._0_8_;
  in_RSI[0x31] = local_500._8_8_;
  in_RSI[0x32] = local_500._16_8_;
  in_RSI[0x33] = local_500._24_8_;
  in_RSI[0x34] = local_500._0_8_;
  in_RSI[0x35] = local_500._8_8_;
  in_RSI[0x36] = local_500._16_8_;
  in_RSI[0x37] = local_500._24_8_;
  in_RSI[0x38] = local_500._0_8_;
  in_RSI[0x39] = local_500._8_8_;
  in_RSI[0x3a] = local_500._16_8_;
  in_RSI[0x3b] = local_500._24_8_;
  in_RSI[0x3c] = local_500._0_8_;
  in_RSI[0x3d] = local_500._8_8_;
  in_RSI[0x3e] = local_500._16_8_;
  in_RSI[0x3f] = local_500._24_8_;
  in_RSI[0x40] = local_500._0_8_;
  in_RSI[0x41] = local_500._8_8_;
  in_RSI[0x42] = local_500._16_8_;
  in_RSI[0x43] = local_500._24_8_;
  in_RSI[0x44] = local_500._0_8_;
  in_RSI[0x45] = local_500._8_8_;
  in_RSI[0x46] = local_500._16_8_;
  in_RSI[0x47] = local_500._24_8_;
  in_RSI[0x48] = local_500._0_8_;
  in_RSI[0x49] = local_500._8_8_;
  in_RSI[0x4a] = local_500._16_8_;
  in_RSI[0x4b] = local_500._24_8_;
  in_RSI[0x4c] = local_500._0_8_;
  in_RSI[0x4d] = local_500._8_8_;
  in_RSI[0x4e] = local_500._16_8_;
  in_RSI[0x4f] = local_500._24_8_;
  in_RSI[0x50] = local_500._0_8_;
  in_RSI[0x51] = local_500._8_8_;
  in_RSI[0x52] = local_500._16_8_;
  in_RSI[0x53] = local_500._24_8_;
  in_RSI[0x54] = local_500._0_8_;
  in_RSI[0x55] = local_500._8_8_;
  in_RSI[0x56] = local_500._16_8_;
  in_RSI[0x57] = local_500._24_8_;
  in_RSI[0x58] = local_500._0_8_;
  in_RSI[0x59] = local_500._8_8_;
  in_RSI[0x5a] = local_500._16_8_;
  in_RSI[0x5b] = local_500._24_8_;
  in_RSI[0x5c] = local_500._0_8_;
  in_RSI[0x5d] = local_500._8_8_;
  in_RSI[0x5e] = local_500._16_8_;
  in_RSI[0x5f] = local_500._24_8_;
  in_RSI[0x60] = local_500._0_8_;
  in_RSI[0x61] = local_500._8_8_;
  in_RSI[0x62] = local_500._16_8_;
  in_RSI[99] = local_500._24_8_;
  in_RSI[100] = local_500._0_8_;
  in_RSI[0x65] = local_500._8_8_;
  in_RSI[0x66] = local_500._16_8_;
  in_RSI[0x67] = local_500._24_8_;
  in_RSI[0x68] = local_500._0_8_;
  in_RSI[0x69] = local_500._8_8_;
  in_RSI[0x6a] = local_500._16_8_;
  in_RSI[0x6b] = local_500._24_8_;
  in_RSI[0x6c] = local_500._0_8_;
  in_RSI[0x6d] = local_500._8_8_;
  in_RSI[0x6e] = local_500._16_8_;
  in_RSI[0x6f] = local_500._24_8_;
  in_RSI[0x70] = local_500._0_8_;
  in_RSI[0x71] = local_500._8_8_;
  in_RSI[0x72] = local_500._16_8_;
  in_RSI[0x73] = local_500._24_8_;
  in_RSI[0x74] = local_500._0_8_;
  in_RSI[0x75] = local_500._8_8_;
  in_RSI[0x76] = local_500._16_8_;
  in_RSI[0x77] = local_500._24_8_;
  in_RSI[0x78] = local_500._0_8_;
  in_RSI[0x79] = local_500._8_8_;
  in_RSI[0x7a] = local_500._16_8_;
  in_RSI[0x7b] = local_500._24_8_;
  in_RSI[0x7c] = local_500._0_8_;
  in_RSI[0x7d] = local_500._8_8_;
  in_RSI[0x7e] = local_500._16_8_;
  in_RSI[0x7f] = local_500._24_8_;
  return;
}

Assistant:

static void idct32_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rounding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i x;
  // stage 0
  // stage 1
  // stage 2
  // stage 3
  // stage 4
  // stage 5
  x = _mm256_mullo_epi32(in[0], cospi32);
  x = _mm256_add_epi32(x, rounding);
  x = _mm256_srai_epi32(x, bit);

  // stage 6
  // stage 7
  // stage 8
  // stage 9
  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    __m256i offset = _mm256_set1_epi32((1 << out_shift) >> 1);
    clamp_lo = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    clamp_hi = _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);
    x = _mm256_add_epi32(offset, x);
    x = _mm256_sra_epi32(x, _mm_cvtsi32_si128(out_shift));
  }
  x = _mm256_max_epi32(x, clamp_lo);
  x = _mm256_min_epi32(x, clamp_hi);
  out[0] = x;
  out[1] = x;
  out[2] = x;
  out[3] = x;
  out[4] = x;
  out[5] = x;
  out[6] = x;
  out[7] = x;
  out[8] = x;
  out[9] = x;
  out[10] = x;
  out[11] = x;
  out[12] = x;
  out[13] = x;
  out[14] = x;
  out[15] = x;
  out[16] = x;
  out[17] = x;
  out[18] = x;
  out[19] = x;
  out[20] = x;
  out[21] = x;
  out[22] = x;
  out[23] = x;
  out[24] = x;
  out[25] = x;
  out[26] = x;
  out[27] = x;
  out[28] = x;
  out[29] = x;
  out[30] = x;
  out[31] = x;
}